

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O1

int xpath_substring(lyxp_set **args,uint16_t arg_count,lyd_node *cur_node,lys_module *param_4,
                   lyxp_set *set,int options)

{
  longdouble lVar1;
  char *pcVar2;
  int iVar3;
  int iVar4;
  ulong uVar5;
  uint16_t str_len;
  uint uVar6;
  uint uVar7;
  long local_78;
  ushort uStack_70;
  long local_58;
  ushort uStack_50;
  
  iVar3 = lyxp_set_cast(*args,LYXP_SET_STRING,cur_node,param_4,options);
  iVar4 = -1;
  if (iVar3 == 0) {
    iVar3 = xpath_round(args + 1,0,cur_node,param_4,args[1],options);
    if (iVar3 == 0) {
      lVar1 = *(longdouble *)&args[1]->val;
      uStack_70 = (ushort)((unkuint10)lVar1 >> 0x40);
      local_78 = SUB108(lVar1,0);
      if (((unkuint10)lVar1 & 0x7fff) == 0 ||
          (ushort)((uStack_70 & 0x7fff) - 1) < 0x7ffe && local_78 < 0) {
        iVar3 = (int)ROUND(-(longdouble)1 + lVar1);
      }
      else {
        iVar3 = ((short)uStack_70 < 0 &&
                ((~uStack_70 & 0x7fff) == 0 && local_78 == -0x8000000000000000)) + 0x7fffffff;
      }
      iVar4 = 0x7fffffff;
      if (arg_count == 3) {
        iVar4 = xpath_round(args + 2,0,cur_node,param_4,args[2],options);
        if (iVar4 != 0) {
          return -1;
        }
        lVar1 = (args[2]->val).num;
        uStack_50 = (ushort)((unkuint10)lVar1 >> 0x40);
        local_58 = SUB108(lVar1,0);
        if (((unkuint10)lVar1 & 0x7fff) == 0 ||
            (ushort)((uStack_50 & 0x7fff) - 1) < 0x7ffe && local_58 < 0) {
          iVar4 = (int)ROUND(lVar1);
        }
        else {
          iVar4 = 0x7fffffff;
          if ((short)uStack_50 < 0) {
            iVar4 = 0;
          }
          if (NAN(lVar1)) {
            iVar4 = 0;
          }
        }
      }
      pcVar2 = ((*args)->val).str;
      if (*pcVar2 == '\0') {
        uVar5 = 0;
        str_len = 0;
      }
      else {
        uVar7 = 0;
        str_len = 0;
        uVar6 = 0;
        do {
          uVar7 = uVar7 & 0xffff;
          if ((int)uVar7 < iVar3) {
            uVar6 = uVar6 + 1;
          }
          else {
            if (iVar4 + iVar3 <= (int)uVar7) break;
            str_len = str_len + 1;
          }
          uVar7 = uVar7 + 1;
        } while (pcVar2[uVar7 & 0xffff] != '\0');
        uVar5 = (ulong)(uVar6 & 0xffff);
      }
      set_fill_string(set,pcVar2 + uVar5,str_len);
      iVar4 = 0;
    }
    else {
      iVar4 = -1;
    }
  }
  return iVar4;
}

Assistant:

static int
xpath_substring(struct lyxp_set **args, uint16_t arg_count, struct lyd_node *cur_node, struct lys_module *local_mod,
                struct lyxp_set *set, int options)
{
    int start, len;
    uint16_t str_start, str_len, pos;

    if (lyxp_set_cast(args[0], LYXP_SET_STRING, cur_node, local_mod, options)) {
        return -1;
    }

    /* start */
    if (xpath_round(&args[1], 1, cur_node, local_mod, args[1], options)) {
        return -1;
    }
    if (isfinite(args[1]->val.num)) {
        start = args[1]->val.num - 1;
    } else if (isinf(args[1]->val.num) && signbit(args[1]->val.num)) {
        start = INT_MIN;
    } else {
        start = INT_MAX;
    }

    /* len */
    if (arg_count == 3) {
        if (xpath_round(&args[2], 1, cur_node, local_mod, args[2], options)) {
            return -1;
        }
        if (isfinite(args[2]->val.num)) {
            len = args[2]->val.num;
        } else if (isnan(args[2]->val.num) || signbit(args[2]->val.num)) {
            len = 0;
        } else {
            len = INT_MAX;
        }
    } else {
        len = INT_MAX;
    }

    /* find matching character positions */
    str_start = 0;
    str_len = 0;
    for (pos = 0; args[0]->val.str[pos]; ++pos) {
        if (pos < start) {
            ++str_start;
        } else if (pos < start + len) {
            ++str_len;
        } else {
            break;
        }
    }

    set_fill_string(set, args[0]->val.str + str_start, str_len);
    return EXIT_SUCCESS;
}